

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashTable.h
# Opt level: O0

void idx2::Init<char_const*,void(*)()>
               (hash_table<const_char_*,_void_(*)()> *Ht,i64 LogCapacityIn,allocator *AllocIn)

{
  bucket_status local_29;
  long local_28;
  i64 Capacity;
  allocator *AllocIn_local;
  i64 LogCapacityIn_local;
  hash_table<const_char_*,_void_(*)()> *Ht_local;
  
  Ht->Alloc = AllocIn;
  Ht->LogCapacity = LogCapacityIn;
  local_28 = 1L << ((byte)LogCapacityIn & 0x3f);
  Capacity = (i64)AllocIn;
  AllocIn_local = (allocator *)LogCapacityIn;
  LogCapacityIn_local = (i64)Ht;
  AllocPtr<char_const*>(&Ht->Keys,local_28 + 1,AllocIn);
  AllocPtr<void(*)()>((_func_void ***)(LogCapacityIn_local + 8),local_28 + 1,(allocator *)Capacity);
  AllocPtr<idx2::hash_table<char_const*,void(*)()>::bucket_status>
            ((bucket_status **)(LogCapacityIn_local + 0x10),local_28 + 1,(allocator *)Capacity);
  local_29 = Empty;
  Fill<idx2::hash_table<char_const*,void(*)()>::bucket_status*,idx2::hash_table<char_const*,void(*)()>::bucket_status>
            (*(bucket_status **)(LogCapacityIn_local + 0x10),
             (bucket_status *)(*(long *)(LogCapacityIn_local + 0x10) + local_28),&local_29);
  *(undefined1 *)(*(long *)(LogCapacityIn_local + 0x10) + local_28) = 2;
  return;
}

Assistant:

void
Init(hash_table<k, v>* Ht, i64 LogCapacityIn, allocator* AllocIn = &Mallocator())
{
  Ht->Alloc = AllocIn;
  Ht->LogCapacity = LogCapacityIn;
  i64 Capacity = 1ll << LogCapacityIn;
  AllocPtr(&Ht->Keys, Capacity + 1, AllocIn);
  AllocPtr(&Ht->Vals, Capacity + 1, AllocIn);
  AllocPtr(&Ht->Stats, Capacity + 1, AllocIn);
  Fill(Ht->Stats, Ht->Stats + Capacity, hash_table<k, v>::Empty);
  Ht->Stats[Capacity] = hash_table<k, v>::Occupied; // sentinel
}